

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlExpression.cpp
# Opt level: O1

bool __thiscall
GdlExpression::TypeCheck
          (GdlExpression *this,
          vector<ExpressionType,_std::allocator<ExpressionType>_> *vexptExpected)

{
  pointer pEVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ExpressionType EVar6;
  bool bVar7;
  ExpressionType exptFound;
  ExpressionType local_c;
  
  iVar2 = (*this->_vptr_GdlExpression[10])(this,&local_c);
  if ((char)iVar2 == '\0') {
    bVar7 = false;
  }
  else {
    pEVar1 = (vexptExpected->super__Vector_base<ExpressionType,_std::allocator<ExpressionType>_>).
             _M_impl.super__Vector_impl_data._M_start;
    lVar3 = (long)(vexptExpected->
                  super__Vector_base<ExpressionType,_std::allocator<ExpressionType>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)pEVar1;
    bVar7 = lVar3 != 0;
    if (bVar7) {
      uVar4 = lVar3 >> 2;
      EVar6 = *pEVar1;
      if (EVar6 != kexptUnknown && EVar6 != local_c) {
        uVar5 = 1;
        do {
          if (EVar6 - kexptNumber < 5 && (local_c & ~kexptNumber) == kexptZero) {
            return bVar7;
          }
          bVar7 = uVar5 < uVar4;
          if (uVar4 + (uVar4 == 0) == uVar5) {
            return bVar7;
          }
          EVar6 = pEVar1[uVar5];
          if (EVar6 == kexptUnknown) {
            return bVar7;
          }
          uVar5 = uVar5 + 1;
        } while (EVar6 != local_c);
      }
    }
  }
  return bVar7;
}

Assistant:

bool GdlExpression::TypeCheck(std::vector<ExpressionType>& vexptExpected)
{
	ExpressionType exptFound;
	if (!CheckTypeAndUnits(&exptFound))
		return false;

	for (size_t i = 0; i < vexptExpected.size(); ++i)
	{
		ExpressionType exptOkay = vexptExpected[i];
		if (exptOkay == exptFound)
			return true;
		if (exptOkay == kexptUnknown)
			return true;
		if ((exptFound == kexptZero || exptFound == kexptOne) &&
			(exptOkay == kexptMeas || exptOkay == kexptNumber || exptOkay == kexptBoolean ||
				exptOkay == kexptZero || exptOkay == kexptOne))
		{
			return true;
		}
	}
	
	return false;
}